

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

void __thiscall
ASTree::findNonRecursive
          (ASTree *this,string *basicString,vector<ASTree_*,_std::allocator<ASTree_*>_> *vector)

{
  ASTree *this_00;
  __type _Var1;
  bool bVar2;
  reference ppAVar3;
  string local_68;
  ASTree *local_48;
  ASTree *child;
  iterator __end1;
  iterator __begin1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__range1;
  vector<ASTree*,std::allocator<ASTree*>> *local_20;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *vector_local;
  string *basicString_local;
  ASTree *this_local;
  
  local_20 = (vector<ASTree*,std::allocator<ASTree*>> *)vector;
  vector_local = (vector<ASTree_*,_std::allocator<ASTree_*>_> *)basicString;
  basicString_local = (string *)this;
  _Var1 = std::operator==(&this->root,basicString);
  if (_Var1) {
    __range1 = &this->subtrees;
    std::vector<ASTree*,std::allocator<ASTree*>>::emplace_back<ASTree*>
              (local_20,(ASTree **)&__range1);
  }
  else {
    __end1 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin(&this->subtrees);
    child = (ASTree *)std::vector<ASTree_*,_std::allocator<ASTree_*>_>::end(&this->subtrees);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>
                                       *)&child), bVar2) {
      ppAVar3 = __gnu_cxx::
                __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
                operator*(&__end1);
      this_00 = *ppAVar3;
      local_48 = this_00;
      std::__cxx11::string::string((string *)&local_68,(string *)basicString);
      findNonRecursive(this_00,&local_68,(vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_20);
      std::__cxx11::string::~string((string *)&local_68);
      __gnu_cxx::__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

void ASTree::findNonRecursive(string basicString, vector<ASTree *> &vector) {
    if (root == basicString) {
        vector.emplace_back(this);
        return;
    }
    for (auto child: subtrees) {
        child->findNonRecursive(basicString, vector);
    }
}